

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  char *__s;
  FilePath *in_RDI;
  char cwd [4097];
  allocator<char> local_1039;
  string local_1038;
  char local_1018 [4104];
  
  memset(local_1018,0,0x1001);
  pcVar1 = getcwd(local_1018,0x1001);
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = local_1018;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1038,__s,&local_1039);
  FilePath(in_RDI,&local_1038);
  std::__cxx11::string::~string((string *)&local_1038);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}